

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::LSTMWeightParams::MergeFrom(LSTMWeightParams *this,LSTMWeightParams *from)

{
  bool bVar1;
  LogMessage *other;
  WeightParams *pWVar2;
  WeightParams *pWVar3;
  LogFinisher local_65;
  uint32_t cached_has_bits;
  byte local_51;
  LogMessage local_50;
  LSTMWeightParams *local_18;
  LSTMWeightParams *from_local;
  LSTMWeightParams *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x8df1);
    local_51 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_65,other);
  }
  if ((local_51 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  bVar1 = _internal_has_inputgateweightmatrix(local_18);
  if (bVar1) {
    pWVar2 = _internal_mutable_inputgateweightmatrix(this);
    pWVar3 = _internal_inputgateweightmatrix(local_18);
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  bVar1 = _internal_has_forgetgateweightmatrix(local_18);
  if (bVar1) {
    pWVar2 = _internal_mutable_forgetgateweightmatrix(this);
    pWVar3 = _internal_forgetgateweightmatrix(local_18);
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  bVar1 = _internal_has_blockinputweightmatrix(local_18);
  if (bVar1) {
    pWVar2 = _internal_mutable_blockinputweightmatrix(this);
    pWVar3 = _internal_blockinputweightmatrix(local_18);
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  bVar1 = _internal_has_outputgateweightmatrix(local_18);
  if (bVar1) {
    pWVar2 = _internal_mutable_outputgateweightmatrix(this);
    pWVar3 = _internal_outputgateweightmatrix(local_18);
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  bVar1 = _internal_has_inputgaterecursionmatrix(local_18);
  if (bVar1) {
    pWVar2 = _internal_mutable_inputgaterecursionmatrix(this);
    pWVar3 = _internal_inputgaterecursionmatrix(local_18);
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  bVar1 = _internal_has_forgetgaterecursionmatrix(local_18);
  if (bVar1) {
    pWVar2 = _internal_mutable_forgetgaterecursionmatrix(this);
    pWVar3 = _internal_forgetgaterecursionmatrix(local_18);
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  bVar1 = _internal_has_blockinputrecursionmatrix(local_18);
  if (bVar1) {
    pWVar2 = _internal_mutable_blockinputrecursionmatrix(this);
    pWVar3 = _internal_blockinputrecursionmatrix(local_18);
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  bVar1 = _internal_has_outputgaterecursionmatrix(local_18);
  if (bVar1) {
    pWVar2 = _internal_mutable_outputgaterecursionmatrix(this);
    pWVar3 = _internal_outputgaterecursionmatrix(local_18);
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  bVar1 = _internal_has_inputgatebiasvector(local_18);
  if (bVar1) {
    pWVar2 = _internal_mutable_inputgatebiasvector(this);
    pWVar3 = _internal_inputgatebiasvector(local_18);
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  bVar1 = _internal_has_forgetgatebiasvector(local_18);
  if (bVar1) {
    pWVar2 = _internal_mutable_forgetgatebiasvector(this);
    pWVar3 = _internal_forgetgatebiasvector(local_18);
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  bVar1 = _internal_has_blockinputbiasvector(local_18);
  if (bVar1) {
    pWVar2 = _internal_mutable_blockinputbiasvector(this);
    pWVar3 = _internal_blockinputbiasvector(local_18);
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  bVar1 = _internal_has_outputgatebiasvector(local_18);
  if (bVar1) {
    pWVar2 = _internal_mutable_outputgatebiasvector(this);
    pWVar3 = _internal_outputgatebiasvector(local_18);
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  bVar1 = _internal_has_inputgatepeepholevector(local_18);
  if (bVar1) {
    pWVar2 = _internal_mutable_inputgatepeepholevector(this);
    pWVar3 = _internal_inputgatepeepholevector(local_18);
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  bVar1 = _internal_has_forgetgatepeepholevector(local_18);
  if (bVar1) {
    pWVar2 = _internal_mutable_forgetgatepeepholevector(this);
    pWVar3 = _internal_forgetgatepeepholevector(local_18);
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  bVar1 = _internal_has_outputgatepeepholevector(local_18);
  if (bVar1) {
    pWVar2 = _internal_mutable_outputgatepeepholevector(this);
    pWVar3 = _internal_outputgatepeepholevector(local_18);
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_18->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void LSTMWeightParams::MergeFrom(const LSTMWeightParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.LSTMWeightParams)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (from._internal_has_inputgateweightmatrix()) {
    _internal_mutable_inputgateweightmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_inputgateweightmatrix());
  }
  if (from._internal_has_forgetgateweightmatrix()) {
    _internal_mutable_forgetgateweightmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_forgetgateweightmatrix());
  }
  if (from._internal_has_blockinputweightmatrix()) {
    _internal_mutable_blockinputweightmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_blockinputweightmatrix());
  }
  if (from._internal_has_outputgateweightmatrix()) {
    _internal_mutable_outputgateweightmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_outputgateweightmatrix());
  }
  if (from._internal_has_inputgaterecursionmatrix()) {
    _internal_mutable_inputgaterecursionmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_inputgaterecursionmatrix());
  }
  if (from._internal_has_forgetgaterecursionmatrix()) {
    _internal_mutable_forgetgaterecursionmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_forgetgaterecursionmatrix());
  }
  if (from._internal_has_blockinputrecursionmatrix()) {
    _internal_mutable_blockinputrecursionmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_blockinputrecursionmatrix());
  }
  if (from._internal_has_outputgaterecursionmatrix()) {
    _internal_mutable_outputgaterecursionmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_outputgaterecursionmatrix());
  }
  if (from._internal_has_inputgatebiasvector()) {
    _internal_mutable_inputgatebiasvector()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_inputgatebiasvector());
  }
  if (from._internal_has_forgetgatebiasvector()) {
    _internal_mutable_forgetgatebiasvector()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_forgetgatebiasvector());
  }
  if (from._internal_has_blockinputbiasvector()) {
    _internal_mutable_blockinputbiasvector()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_blockinputbiasvector());
  }
  if (from._internal_has_outputgatebiasvector()) {
    _internal_mutable_outputgatebiasvector()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_outputgatebiasvector());
  }
  if (from._internal_has_inputgatepeepholevector()) {
    _internal_mutable_inputgatepeepholevector()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_inputgatepeepholevector());
  }
  if (from._internal_has_forgetgatepeepholevector()) {
    _internal_mutable_forgetgatepeepholevector()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_forgetgatepeepholevector());
  }
  if (from._internal_has_outputgatepeepholevector()) {
    _internal_mutable_outputgatepeepholevector()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_outputgatepeepholevector());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}